

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSSetMassNormFactor(void *arkode_mem,realtype nrmfac)

{
  int iVar1;
  sunindextype sVar2;
  realtype rVar3;
  double __x;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLSSetMassNormFactor",&local_18,&local_20);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (nrmfac <= 0.0) {
    if (0.0 <= nrmfac) {
      sVar2 = N_VGetLength(local_18->tempv1);
      if (sVar2 < 1) {
        nrmfac = 0.0;
        goto LAB_004af068;
      }
      sVar2 = N_VGetLength(local_18->tempv1);
      __x = (double)sVar2;
    }
    else {
      N_VConst(1.0,local_18->tempv1);
      rVar3 = N_VDotProd(local_18->tempv1,local_18->tempv1);
      nrmfac = 0.0;
      if (rVar3 <= 0.0) goto LAB_004af068;
      __x = N_VDotProd(local_18->tempv1,local_18->tempv1);
    }
    if (__x < 0.0) {
      nrmfac = sqrt(__x);
    }
    else {
      nrmfac = SQRT(__x);
    }
  }
LAB_004af068:
  local_20->nrmfac = nrmfac;
  return 0;
}

Assistant:

int arkLSSetMassNormFactor(void *arkode_mem, realtype nrmfac)
{
  ARKodeMem     ark_mem;
  ARKLsMassMem  arkls_mem;
  int           retval;

  /* access ARKLsMem structure; store input and return */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLSSetMassNormFactor",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) return(retval);

  if (nrmfac > ZERO) {
    /* set user-provided factor */
    arkls_mem->nrmfac = nrmfac;
  } else if (nrmfac < ZERO) {
    /* compute factor for WRMS norm with dot product */
    N_VConst(ONE, ark_mem->tempv1);
    arkls_mem->nrmfac = SUNRsqrt(N_VDotProd(ark_mem->tempv1, ark_mem->tempv1));
  } else {
    /* compute default factor for WRMS norm from vector legnth */
    arkls_mem->nrmfac = SUNRsqrt(N_VGetLength(ark_mem->tempv1));
  }

  return(ARKLS_SUCCESS);
}